

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onConnect(Connection *this,ConnectRequest *request)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  LoopResult LVar6;
  undefined8 *puVar7;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  HttpHeaders *pHVar8;
  Promise<kj::HttpServer::Connection::LoopResult> *pPVar9;
  Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_> *maybe;
  Own<kj::HttpService,_std::nullptr_t> *pOVar10;
  OwnOwn<kj::HttpService,_std::nullptr_t> *pOVar11;
  HttpService *pHVar12;
  RefOrVoid<kj::AsyncIoStream> pAVar13;
  Own<kj::AsyncIoStream,_std::nullptr_t> *attachments_1;
  Promise<void> *promise;
  Promise<kj::HttpServer::Connection::LoopResult> *pPVar14;
  Promise<void> *pPVar15;
  long *plVar16;
  undefined8 *puVar17;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr__;
  Connection *this_01;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___00;
  Connection *this_02;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method;
  Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
  *this_03;
  Own<kj::HttpService,_std::nullptr_t> *this_04;
  Connection *this_05;
  PromiseAwaiter<void> *__return_storage_ptr___01;
  Own<kj::HttpService,_std::nullptr_t> *attachments;
  long *plVar18;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___02;
  PromiseAwaiter<void> *__return_storage_ptr___03;
  HttpOutputStream *this_06;
  long in_RDX;
  ArrayPtr<const_char> AVar19;
  void *pvVar20;
  void *in_stack_ffffffffffffefa0;
  int local_fe0;
  int local_f94;
  int local_f38;
  int local_ed0;
  Fault local_7b0;
  undefined1 local_7a8 [8];
  OwnOwn<kj::HttpService,_std::nullptr_t> _kj_result;
  HttpConnectMethod local_749 [577];
  undefined8 local_508;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  Maybe<kj::StringPtr> local_4f0 [22];
  undefined8 local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  Maybe<kj::StringPtr> local_2c0;
  HttpConnectMethod local_2a1;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_2a0 [39];
  long local_28;
  ConnectRequest *request_local;
  Connection *this_local;
  
  local_28 = in_RDX;
  request_local = request;
  this_local = this;
  puVar7 = (undefined8 *)operator_new(0xc40);
  *puVar7 = onConnect;
  puVar7[1] = onConnect;
  plVar16 = puVar7 + 0x17b;
  puVar17 = puVar7 + 0x17d;
  __return_storage_ptr__ = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0x47)
  ;
  this_01 = (Connection *)(puVar7 + 0x17e);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0x7e);
  this_02 = (Connection *)(puVar7 + 0x17f);
  method = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar7 + 0x171);
  this_03 = (Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
             *)(puVar7 + 0x173);
  this_04 = (Own<kj::HttpService,_std::nullptr_t> *)(puVar7 + 0x175);
  this_05 = (Connection *)(puVar7 + 0x177);
  __return_storage_ptr___01 = (PromiseAwaiter<void> *)(puVar7 + 0xb5);
  pPVar15 = (Promise<void> *)(puVar7 + 0x180);
  attachments = (Own<kj::HttpService,_std::nullptr_t> *)(puVar7 + 0x181);
  plVar18 = puVar7 + 0x182;
  pPVar9 = (Promise<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0x184);
  __return_storage_ptr___02 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0xec);
  __return_storage_ptr___03 = (PromiseAwaiter<void> *)(puVar7 + 0x123);
  this_06 = (HttpOutputStream *)(puVar7 + 0x185);
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 2);
  puVar7[0x186] = request;
  *plVar16 = local_28;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar7 + 0x16e),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"onConnect",0x1deb,0x1b);
  pvVar20 = (void *)puVar7[0x170];
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine
            (this_00,*(SourceLocation *)(puVar7 + 0x16e));
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar5 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar7 + 0xc3d));
  if (bVar5) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar7 + 0xc3d));
    pHVar8 = anon_unknown_36::HttpInputStreamImpl::getHeaders
                       ((HttpInputStreamImpl *)(puVar7[0x186] + 0x38));
    *puVar17 = pHVar8;
    OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpConnectMethod,int>
              ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)local_2a0,&local_2a1);
    Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
              ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)(puVar7[0x186] + 0x148),
               local_2a0);
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(local_2a0);
    local_2d8 = 0;
    uStack_2d0 = 5;
    uStack_2cc = 0;
    HttpHeaders::get(&local_2c0,(HttpHeaders *)*puVar17,(HttpHeaderId)(ZEXT416(5) << 0x40));
    bVar5 = Maybe<kj::StringPtr>::operator==(&local_2c0);
    Maybe<kj::StringPtr>::~Maybe(&local_2c0);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      local_508 = 0;
      uStack_500 = 6;
      uStack_4fc = 0;
      HttpHeaders::get(local_4f0,(HttpHeaders *)*puVar17,(HttpHeaderId)(ZEXT416(6) << 0x40));
      bVar5 = Maybe<kj::StringPtr>::operator==(local_4f0);
      Maybe<kj::StringPtr>::~Maybe(local_4f0);
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpConnectMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)method,local_749);
        SuspendableRequest::SuspendableRequest
                  ((SuspendableRequest *)(puVar7 + 0x168),(Connection *)puVar7[0x186],method,
                   (StringPtr)*(ArrayPtr<const_char> *)*plVar16,(HttpHeaders *)*puVar17);
        lVar1 = puVar7[0x186];
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(method);
        Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
        ::operator()(this_03,(SuspendableRequest *)(lVar1 + 0x28));
        if ((*(byte *)(puVar7[0x186] + 0x166) & 1) == 0) {
          maybe = mv<kj::Maybe<kj::Own<kj::HttpService,decltype(nullptr)>>>
                            ((Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_> *)this_03);
          kj::_::readMaybe<kj::HttpService,decltype(nullptr)>((_ *)local_7a8,maybe);
          pOVar10 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_7a8);
          if (pOVar10 == (Own<kj::HttpService,_std::nullptr_t> *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                      (&local_7b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x1e13,FAILED,"kj::mv(maybeService) != nullptr",
                       "\"SuspendableHttpServiceFactory did not suspend, but returned kj::none.\"",
                       (char (*) [70])
                       "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
            kj::_::Debug::Fault::fatal(&local_7b0);
          }
          pOVar11 = mv<kj::_::OwnOwn<kj::HttpService,decltype(nullptr)>>
                              ((OwnOwn<kj::HttpService,_std::nullptr_t> *)local_7a8);
          kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::OwnOwn
                    ((OwnOwn<kj::HttpService,_std::nullptr_t> *)&_kj_result.value.ptr,pOVar11);
          kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<kj::HttpService,_std::nullptr_t> *)local_7a8);
          pOVar10 = kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::operator*
                              ((OwnOwn<kj::HttpService,_std::nullptr_t> *)&_kj_result.value.ptr);
          Own<kj::HttpService,_std::nullptr_t>::Own(this_04,pOVar10);
          kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<kj::HttpService,_std::nullptr_t> *)&_kj_result.value.ptr);
          getConnectStream(this_05);
          pHVar12 = Own<kj::HttpService,_std::nullptr_t>::operator->(this_04);
          uVar3 = *(undefined8 *)*plVar16;
          uVar4 = ((undefined8 *)*plVar16)[1];
          uVar2 = *puVar17;
          pAVar13 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator*
                              ((Own<kj::AsyncIoStream,_std::nullptr_t> *)this_05);
          lVar1 = puVar7[0x186];
          *(undefined1 *)(puVar7 + 0x179) = 0;
          Maybe<kj::Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_>_&>::Maybe
                    ((Maybe<kj::Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_>_&> *)
                     (puVar7 + 0x17a));
          (*pHVar12->_vptr_HttpService[1])
                    (attachments,pHVar12,uVar3,uVar4,uVar2,pAVar13,lVar1 + 8,puVar7 + 0x179);
          attachments_1 =
               (Own<kj::AsyncIoStream,_std::nullptr_t> *)
               mv<kj::Own<kj::HttpService,decltype(nullptr)>>(this_04);
          mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                    ((Own<kj::AsyncIoStream,_std::nullptr_t> *)this_05);
          Promise<void>::
          attach<kj::Own<kj::HttpService,decltype(nullptr)>,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                    (pPVar15,attachments,attachments_1);
          promise = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                    await_transform<kj::Promise<void>>(this_00,pPVar15);
          co_await<void>(__return_storage_ptr___01,promise);
          bVar5 = kj::_::PromiseAwaiterBase::await_ready
                            ((PromiseAwaiterBase *)__return_storage_ptr___01);
          if (!bVar5) {
            *(undefined1 *)((long)puVar7 + 0xc3c) = 3;
            onConnect(in_stack_ffffffffffffefa0,pvVar20);
            if ((extraout_AL_01 & 1) != 0) {
              return (PromiseBase)(PromiseBase)this;
            }
          }
          kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___01);
          kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___01);
          Promise<void>::~Promise(pPVar15);
          Promise<void>::~Promise((Promise<void> *)attachments);
          pPVar14 = kj::_::readMaybe<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                              ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)
                               (puVar7[0x186] + 0x178));
          *plVar18 = (long)pPVar14;
          if (*plVar18 == 0) {
            local_fe0 = 0;
          }
          else {
            lVar1 = puVar7[0x186];
            puVar7[0x183] = *plVar18;
            pPVar14 = mv<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                                ((Promise<kj::HttpServer::Connection::LoopResult> *)puVar7[0x183]);
            Promise<kj::HttpServer::Connection::LoopResult>::Promise(pPVar9,pPVar14);
            Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
                      ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)
                       (lVar1 + 0x178));
            pPVar14 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                      await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>&>
                                (this_00,pPVar9);
            co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___02,pPVar14);
            bVar5 = kj::_::PromiseAwaiterBase::await_ready
                              ((PromiseAwaiterBase *)__return_storage_ptr___02);
            if (!bVar5) {
              *(undefined1 *)((long)puVar7 + 0xc3c) = 4;
              onConnect(in_stack_ffffffffffffefa0,pvVar20);
              if ((extraout_AL_02 & 1) != 0) {
                return (PromiseBase)(PromiseBase)this;
              }
            }
            LVar6 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                              (__return_storage_ptr___02);
            kj::_::
            CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
            ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                            *)this_00,LVar6);
            kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                      (__return_storage_ptr___02);
            Promise<kj::HttpServer::Connection::LoopResult>::~Promise(pPVar9);
            local_fe0 = 3;
          }
          if (local_fe0 == 0) {
            bVar5 = anon_unknown_36::HttpOutputStream::isBroken
                              ((HttpOutputStream *)(puVar7[0x186] + 0x128));
            if (bVar5) {
              kj::_::
              CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
              ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                              *)this_00,BREAK_LOOP_CONN_ERR);
              local_f94 = 3;
            }
            else {
              anon_unknown_36::HttpOutputStream::flush(this_06);
              pPVar15 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                        await_transform<kj::Promise<void>>(this_00,(Promise<void> *)this_06);
              co_await<void>(__return_storage_ptr___03,pPVar15);
              bVar5 = kj::_::PromiseAwaiterBase::await_ready
                                ((PromiseAwaiterBase *)__return_storage_ptr___03);
              if (!bVar5) {
                *(undefined1 *)((long)puVar7 + 0xc3c) = 5;
                onConnect(in_stack_ffffffffffffefa0,pvVar20);
                if ((extraout_AL_03 & 1) != 0) {
                  return (PromiseBase)(PromiseBase)this;
                }
              }
              kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___03);
              kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___03);
              Promise<void>::~Promise((Promise<void> *)this_06);
              kj::_::
              CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
              ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                              *)this_00,BREAK_LOOP_CONN_ERR);
              local_f94 = 3;
            }
          }
          else {
            local_f94 = local_fe0;
          }
          Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
                    ((Own<kj::AsyncIoStream,_std::nullptr_t> *)this_05);
          Own<kj::HttpService,_std::nullptr_t>::~Own(this_04);
          local_f38 = local_f94;
        }
        else {
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_00,BREAK_LOOP_CONN_ERR);
          local_f38 = 3;
        }
        Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>::~Maybe
                  ((Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_> *)this_03);
        SuspendableRequest::~SuspendableRequest((SuspendableRequest *)(puVar7 + 0x168));
        local_ed0 = local_f38;
      }
      else {
        ((ProtocolError *)(puVar7 + 0x161))->statusCode = 400;
        AVar19 = (ArrayPtr<const_char>)operator____kj("Bad Request",0xb);
        *(ArrayPtr<const_char> *)(puVar7 + 0x162) = AVar19;
        AVar19 = (ArrayPtr<const_char>)operator____kj("Bad Request",0xb);
        *(ArrayPtr<const_char> *)(puVar7 + 0x164) = AVar19;
        ArrayPtr<char>::ArrayPtr((ArrayPtr<char> *)(puVar7 + 0x166),(void *)0x0);
        pvVar20 = (void *)puVar7[0x163];
        in_stack_ffffffffffffefa0 = (void *)puVar7[0x164];
        sendError(this_02,*(ProtocolError *)(puVar7 + 0x161));
        pPVar9 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                 await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                           (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_02);
        co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___00,pPVar9);
        bVar5 = kj::_::PromiseAwaiterBase::await_ready
                          ((PromiseAwaiterBase *)__return_storage_ptr___00);
        if (!bVar5) {
          *(undefined1 *)((long)puVar7 + 0xc3c) = 2;
          onConnect(in_stack_ffffffffffffefa0,pvVar20);
          if ((extraout_AL_00 & 1) != 0) {
            return (PromiseBase)(PromiseBase)this;
          }
        }
        LVar6 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                          (__return_storage_ptr___00);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,LVar6);
        kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                  (__return_storage_ptr___00);
        Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                  ((Promise<kj::HttpServer::Connection::LoopResult> *)this_02);
        local_ed0 = 3;
      }
    }
    else {
      ((ProtocolError *)(puVar7 + 0x15a))->statusCode = 400;
      AVar19 = (ArrayPtr<const_char>)operator____kj("Bad Request",0xb);
      *(ArrayPtr<const_char> *)(puVar7 + 0x15b) = AVar19;
      AVar19 = (ArrayPtr<const_char>)operator____kj("Bad Request",0xb);
      *(ArrayPtr<const_char> *)(puVar7 + 0x15d) = AVar19;
      ArrayPtr<char>::ArrayPtr((ArrayPtr<char> *)(puVar7 + 0x15f),(void *)0x0);
      pvVar20 = (void *)puVar7[0x15c];
      in_stack_ffffffffffffefa0 = (void *)puVar7[0x15d];
      sendError(this_01,*(ProtocolError *)(puVar7 + 0x15a));
      pPVar9 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
               await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                         (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_01);
      co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr__,pPVar9);
      bVar5 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar5) {
        *(undefined1 *)((long)puVar7 + 0xc3c) = 1;
        onConnect(in_stack_ffffffffffffefa0,pvVar20);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      LVar6 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                        (__return_storage_ptr__);
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                      *)this_00,LVar6);
      kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                (__return_storage_ptr__);
      Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                ((Promise<kj::HttpServer::Connection::LoopResult> *)this_01);
      local_ed0 = 3;
    }
    if (local_ed0 == 3) {
      kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
      bVar5 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar7 + 0xc3e));
      if (!bVar5) {
        *puVar7 = 0;
        *(undefined1 *)((long)puVar7 + 0xc3c) = 6;
        onConnect(in_stack_ffffffffffffefa0,pvVar20);
        return (PromiseBase)(PromiseBase)this;
      }
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar7 + 0xc3e));
    }
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::~Coroutine(this_00);
    if (puVar7 != (undefined8 *)0x0) {
      operator_delete(puVar7,0xc40);
    }
  }
  else {
    *(undefined1 *)((long)puVar7 + 0xc3c) = 0;
    onConnect(in_stack_ffffffffffffefa0,pvVar20);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> onConnect(HttpHeaders::ConnectRequest& request) {
    auto& headers = httpInput.getHeaders();

    currentMethod = HttpConnectMethod();

    // The HTTP specification says that CONNECT requests have no meaningful payload
    // but stops short of saying that CONNECT *cannot* have a payload. Implementations
    // can choose to either accept payloads or reject them. We choose to reject it.
    // Specifically, if there are Content-Length or Transfer-Encoding headers in the
    // request headers, we'll automatically reject the CONNECT request.
    //
    // The key implication here is that any data that immediately follows the headers
    // block of the CONNECT request is considered to be part of the tunnel if it is
    // established.

    if (headers.get(HttpHeaderId::CONTENT_LENGTH) != kj::none) {
      co_return co_await sendError(HttpHeaders::ProtocolError {
        400,
        "Bad Request"_kj,
        "Bad Request"_kj,
        nullptr,
      });
    }
    if (headers.get(HttpHeaderId::TRANSFER_ENCODING) != kj::none) {
      co_return co_await sendError(HttpHeaders::ProtocolError {
        400,
        "Bad Request"_kj,
        "Bad Request"_kj,
        nullptr,
      });
    }

    SuspendableRequest suspendable(*this, HttpConnectMethod(), request.authority, headers);
    auto maybeService = factory(suspendable);

    if (suspended) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    auto service = KJ_ASSERT_NONNULL(kj::mv(maybeService),
        "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
    auto connectStream = getConnectStream();
    co_await service->connect(
        request.authority, headers, *connectStream, *this, {})
        .attach(kj::mv(service), kj::mv(connectStream));


    KJ_IF_SOME(p, tunnelRejected) {
      // reject() was called to reject a CONNECT attempt.
      // Finish sending and close the connection.
      auto promise = kj::mv(p);
      tunnelRejected = kj::none;
      co_return co_await promise;
    }

    if (httpOutput.isBroken()) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    co_await httpOutput.flush();
    co_return BREAK_LOOP_CONN_ERR;
  }